

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O0

void __thiscall
helix::parity::pmd_handler::process_msg(pmd_handler *this,pmd_order_canceled *m,bool sync)

{
  order_book *this_00;
  bool bVar1;
  __uint32_t _Var2;
  pointer ppVar3;
  uint64_t timestamp_00;
  byte in_DL;
  long in_RSI;
  pmd_handler *in_RDI;
  uint64_t in_stack_00000010;
  uint64_t in_stack_00000018;
  order_book *in_stack_00000020;
  uint64_t timestamp;
  uint32_t quantity;
  order_book *ob;
  iterator it;
  uint64_t order_id;
  unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
  *in_stack_ffffffffffffff58;
  event *__args;
  order_book *in_stack_ffffffffffffff68;
  uint64_t in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_28;
  __uint64_t local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_20 = __bswap_64(*(__uint64_t *)(in_RSI + 5));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x1528ee);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>
                         *)0x152931);
    this_00 = ppVar3->second;
    __bswap_32(*(__uint32_t *)(local_10 + 0xd));
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 1));
    timestamp_00 = to_timestamp(in_RDI,(ulong)_Var2);
    order_book::cancel(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    order_book::set_timestamp(this_00,timestamp_00);
    if ((local_11 & 1) != 0) {
      order_book::symbol_abi_cxx11_(this_00);
      __args = (event *)&stack0xffffffffffffff78;
      make_ob_event(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                    (event_mask)((ulong)in_RDI >> 0x20));
      std::function<void_(const_helix::event_&)>::operator()(&in_RDI->_process_event,__args);
      event::~event((event *)0x1529e4);
    }
  }
  return;
}

Assistant:

void pmd_handler::process_msg(const pmd_order_canceled* m, bool sync)
{
    uint64_t order_id = be64toh(m->OrderNumber);
    auto it = _order_id_map.find(order_id);
    if (it != _order_id_map.end()) {
        auto& ob = it->second;
        uint32_t quantity  = be32toh(m->CanceledQuantity);
        uint64_t timestamp = to_timestamp(be32toh(m->Timestamp));
        ob.cancel(order_id, quantity);
        ob.set_timestamp(timestamp);
        if (sync) {
            _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
        }
    }
}